

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseNoFrames(TidyDocImpl *doc,Node *noframes,GetTokenMode mode)

{
  int iVar1;
  TidyParserMemory *pTVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  Node *pNVar5;
  TidyParserMemory data;
  bool bVar6;
  Bool BVar7;
  long lVar8;
  Node *pNVar9;
  Node **ppNVar10;
  Node *pNVar11;
  Node *node;
  Node *pNVar12;
  int iVar13;
  bool bVar14;
  TidyParserMemory memory;
  long local_58;
  Node *local_38;
  
  if (noframes == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar8 = (long)iVar1;
    if (-1 < lVar8) {
      pTVar2 = (doc->stack).content;
      noframes = pTVar2[lVar8].original_node;
      pNVar12 = pTVar2[lVar8].reentry_node;
      iVar13 = pTVar2[lVar8].reentry_state;
      bVar14 = pTVar2[lVar8].register_1 == 0;
      (doc->stack).top = iVar1 + -1;
      goto LAB_0013e4df;
    }
    noframes = (Node *)0x0;
  }
  else if ((doc->config).value[1].v == 0) {
    *(byte *)&doc->badAccess = (byte)doc->badAccess | 0x20;
  }
  bVar14 = true;
  pNVar12 = (Node *)0x0;
  iVar13 = 0;
LAB_0013e4df:
  pLVar3 = doc->lexer;
  pNVar9 = local_38;
  node = pNVar12;
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            if (iVar13 == 0) {
              pNVar12 = prvTidyGetToken(doc,IgnoreWhitespace);
            }
            else if (iVar13 == 2) {
              prvTidyReport(doc,noframes,node,0x25a);
              return (Node *)0x0;
            }
            if (iVar13 == 0) break;
            if (((iVar13 == 1) && (pNVar9 = local_38, iVar13 = 0, node = pNVar12, !bVar14)) &&
               (pNVar11 = prvTidyFindBody(doc), pNVar11 != pNVar12)) {
              prvTidyCoerceNode(doc,pNVar12,TidyTag_DIV,no,no);
              pNVar11 = prvTidyFindBody(doc);
              iVar13 = 0;
              if (pNVar11 != (Node *)0x0) {
                prvTidyRemoveNode(pNVar12);
                pNVar12->parent = pNVar11;
                pNVar5 = pNVar11->last;
                ppNVar10 = &pNVar5->next;
                if (pNVar5 == (Node *)0x0) {
                  ppNVar10 = &pNVar11->content;
                }
                pNVar12->prev = pNVar5;
                *ppNVar10 = pNVar12;
                pNVar11->last = pNVar12;
                iVar13 = 0;
              }
            }
          }
          if (pNVar12 != (Node *)0x0) break;
          iVar13 = 2;
          pNVar12 = (Node *)0x0;
          local_38 = pNVar9;
          node = pNVar12;
        }
        pDVar4 = pNVar12->tag;
        if ((pDVar4 == noframes->tag) && (pNVar12->type == EndTag)) {
          prvTidyFreeNode(doc,pNVar12);
          noframes->closed = yes;
          TrimSpaces(doc,noframes);
          return (Node *)0x0;
        }
        if (pDVar4 == (Dict *)0x0) break;
        if (pDVar4->id == TidyTag_FRAME) {
LAB_0013e83f:
          TrimSpaces(doc,noframes);
          if (pNVar12->type == EndTag) {
            prvTidyReport(doc,noframes,pNVar12,0x235);
            prvTidyFreeNode(doc,pNVar12);
            return (Node *)0x0;
          }
          prvTidyReport(doc,noframes,pNVar12,0x259);
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
        if (pDVar4 == (Dict *)0x0) break;
        if (pDVar4->id == TidyTag_FRAMESET) goto LAB_0013e83f;
        if ((pDVar4 == (Dict *)0x0) || (pDVar4->id != TidyTag_HTML)) break;
        BVar7 = prvTidynodeIsElement(pNVar12);
        if (BVar7 != no) goto LAB_0013e5c1;
LAB_0013e5d6:
        prvTidyFreeNode(doc,pNVar12);
      }
      BVar7 = InsertMisc(noframes,pNVar12);
    } while (BVar7 != no);
    if (((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->id == TidyTag_BODY)) &&
       (pNVar12->type == StartTag)) {
      local_58 = (ulong)pLVar3->seenEndBody << 0x20;
      pNVar12->parent = noframes;
      if (noframes == (Node *)0x0) {
        pNVar12->prev = (Node *)0x0;
LAB_0013e92b:
        if (noframes == (Node *)0x0) goto LAB_0013e940;
        ppNVar10 = &noframes->content;
      }
      else {
        pNVar9 = noframes->last;
        pNVar12->prev = pNVar9;
        if (pNVar9 == (Node *)0x0) goto LAB_0013e92b;
        ppNVar10 = &pNVar9->next;
      }
      *ppNVar10 = pNVar12;
      if (noframes != (Node *)0x0) {
        noframes->last = pNVar12;
      }
LAB_0013e940:
      data.original_node = noframes;
      data.identity = prvTidyParseNoFrames;
      data.reentry_node = pNVar12;
      data.reentry_mode = IgnoreWhitespace;
      data.reentry_state = 1;
      data.mode = (undefined4)local_58;
      data.register_1 = local_58._4_4_;
      data._40_8_ = 0;
      prvTidypushMemory(doc,data);
      return pNVar12;
    }
    BVar7 = prvTidynodeIsText(pNVar12);
    if ((BVar7 == no) && ((pNVar12->tag == (Dict *)0x0 || (pNVar12->type == EndTag)))) {
LAB_0013e5c1:
      prvTidyReport(doc,noframes,pNVar12,0x235);
      goto LAB_0013e5d6;
    }
    pNVar11 = prvTidyFindBody(doc);
    if (pNVar11 == (Node *)0x0) {
      if (pLVar3->seenEndBody == no) {
        prvTidyUngetToken(doc);
        pNVar9 = prvTidyInferredTag(doc,TidyTag_BODY);
        if (*(int *)((doc->config).value + 100) != 0) {
          prvTidyReport(doc,noframes,pNVar9,0x247);
        }
        pNVar9->parent = noframes;
        if (noframes == (Node *)0x0) {
          pNVar9->prev = (Node *)0x0;
LAB_0013e772:
          if (noframes != (Node *)0x0) {
            noframes->content = pNVar9;
LAB_0013e77f:
            noframes->last = pNVar9;
          }
        }
        else {
          pNVar12 = noframes->last;
          pNVar9->prev = pNVar12;
          if (pNVar12 == (Node *)0x0) goto LAB_0013e772;
          pNVar12->next = pNVar9;
          if (noframes != (Node *)0x0) goto LAB_0013e77f;
        }
        goto LAB_0013e6a5;
      }
      prvTidyReport(doc,noframes,pNVar12,0x235);
      prvTidyFreeNode(doc,pNVar12);
      bVar6 = true;
    }
    else {
      BVar7 = prvTidynodeIsText(pNVar12);
      pNVar9 = pNVar12;
      if (BVar7 != no) {
        prvTidyUngetToken(doc);
        pNVar9 = prvTidyInferredTag(doc,TidyTag_P);
        prvTidyReport(doc,noframes,pNVar9,0x233);
      }
      pNVar9->parent = pNVar11;
      if (pNVar11 == (Node *)0x0) {
        pNVar9->prev = (Node *)0x0;
LAB_0013e690:
        if (pNVar11 == (Node *)0x0) goto LAB_0013e6a5;
        ppNVar10 = &pNVar11->content;
      }
      else {
        pNVar12 = pNVar11->last;
        pNVar9->prev = pNVar12;
        if (pNVar12 == (Node *)0x0) goto LAB_0013e690;
        ppNVar10 = &pNVar12->next;
      }
      *ppNVar10 = pNVar9;
      if (pNVar11 != (Node *)0x0) {
        pNVar11->last = pNVar9;
      }
LAB_0013e6a5:
      prvTidypushMemory(doc,(TidyParserMemory)
                            ZEXT2448(CONCAT816(pNVar9,CONCAT88(noframes,prvTidyParseNoFrames))));
      bVar6 = false;
      pNVar12 = pNVar9;
    }
    if (!bVar6) {
      return pNVar9;
    }
  } while( true );
}

Assistant:

Node* TY_(ParseNoFrames)( TidyDocImpl* doc, Node *noframes, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool body_seen = no;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NODEISBODY,        /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( noframes == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because we replace it entering the loop anyway.*/
        DEBUG_LOG_REENTER_WITH_NODE(node);
        noframes = memory.original_node;
        state = memory.reentry_state;
        body_seen = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(noframes);
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            doc->badAccess |=  BA_USING_NOFRAMES;
        }
    }

    mode = IgnoreWhitespace;

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
        {
            node = TY_(GetToken)(doc, mode);
            DEBUG_LOG_GOT_TOKEN(node);
        }
        
        switch ( state )
        {
            case STATE_INITIAL:
            {
                if ( node == NULL )
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if ( node->tag == noframes->tag && node->type == EndTag )
                {
                    TY_(FreeNode)( doc, node);
                    noframes->closed = yes;
                    TrimSpaces(doc, noframes);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if ( nodeIsFRAME(node) || nodeIsFRAMESET(node) )
                {
                    TrimSpaces(doc, noframes);
                    if (node->type == EndTag)
                    {
                        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);       /* Throw it away */
                    }
                    else
                    {
                        TY_(Report)(doc, noframes, node, MISSING_ENDTAG_BEFORE);
                        TY_(UngetToken)( doc );
                    }
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if ( nodeIsHTML(node) )
                {
                    if (TY_(nodeIsElement)(node))
                        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);

                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* deal with comments etc. */
                if (InsertMisc(noframes, node))
                    continue;

                if ( nodeIsBODY(node) && node->type == StartTag )
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseNoFrames);
                    memory.original_node = noframes;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_POST_NODEISBODY;
                    memory.register_1 = lexer->seenEndBody;
                    memory.mode = IgnoreWhitespace;

                    TY_(InsertNodeAtEnd)(noframes, node);
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }

                /* implicit body element inferred */
                if (TY_(nodeIsText)(node) || (node->tag && node->type != EndTag))
                {
                    Node *body = TY_(FindBody)( doc );
                    if ( body || lexer->seenEndBody )
                    {
                        if ( body == NULL )
                        {
                            TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                            TY_(FreeNode)( doc, node);
                            continue;
                        }
                        if ( TY_(nodeIsText)(node) )
                        {
                            TY_(UngetToken)( doc );
                            node = TY_(InferredTag)(doc, TidyTag_P);
                            TY_(Report)(doc, noframes, node, CONTENT_AFTER_BODY );
                        }
                        TY_(InsertNodeAtEnd)( body, node );
                    }
                    else
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        if ( cfgBool(doc, TidyXmlOut) )
                            TY_(Report)(doc, noframes, node, INSERTING_TAG);
                        TY_(InsertNodeAtEnd)( noframes, node );
                    }

                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParseNoFrames);
                        memory.original_node = noframes;
                        memory.reentry_node = node;
                        memory.mode = IgnoreWhitespace; /*MixedContent*/
                        memory.reentry_state = STATE_INITIAL;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                /* discard unexpected end tags */
                TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            } break;
                
                
            case STATE_POST_NODEISBODY:
            {
                /* fix for bug http://tidy.sf.net/bug/887259 */
                if (body_seen && TY_(FindBody)(doc) != node)
                {
                    TY_(CoerceNode)(doc, node, TidyTag_DIV, no, no);
                    MoveNodeToBody(doc, node);
                }
                state = STATE_INITIAL;
                continue;

            } break;
                
                
            default:
                break;
        } /* switch */
    } /* while */

    TY_(Report)(doc, noframes, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}